

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O2

adt_error_t adt_bytearray_reserve(adt_bytearray_t *self,uint32_t u32NewLen)

{
  adt_error_t aVar1;
  
  if (self == (adt_bytearray_t *)0x0) {
    return '\x01';
  }
  if (self->u32AllocLen < u32NewLen) {
    aVar1 = adt_bytearray_grow(self,u32NewLen);
    if (aVar1 != '\0') {
      return aVar1;
    }
  }
  return '\0';
}

Assistant:

adt_error_t adt_bytearray_reserve(adt_bytearray_t *self, uint32_t u32NewLen){
   if(self){
      if(u32NewLen > self->u32AllocLen){
         adt_error_t errorCode = adt_bytearray_grow(self,u32NewLen);
         if(errorCode != ADT_NO_ERROR){
            return errorCode;
         }
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}